

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_math.cpp
# Opt level: O0

double getPSNR(TRIPLEBYTES **mrx1,TRIPLEBYTES **mrx2,int y,int x,int h,int w,int component)

{
  byte bVar1;
  byte bVar2;
  __type _Var3;
  double dVar4;
  undefined4 local_38;
  undefined4 local_34;
  int j;
  int i;
  double count;
  int w_local;
  int h_local;
  int x_local;
  int y_local;
  TRIPLEBYTES **mrx2_local;
  TRIPLEBYTES **mrx1_local;
  
  _j = 0.0;
  for (local_34 = y; local_38 = x, local_34 < h; local_34 = local_34 + 1) {
    for (; local_38 < w; local_38 = local_38 + 1) {
      bVar1 = getComponent(mrx1,local_34,local_38,component);
      bVar2 = getComponent(mrx2,local_34,local_38,component);
      _Var3 = std::pow<int,int>((uint)bVar1 - (uint)bVar2,2);
      _j = _Var3 + _j;
    }
  }
  _Var3 = std::pow<int,int>(0xff,2);
  dVar4 = log10(((double)((w - x) * (h - y)) * _Var3) / _j);
  return dVar4 * 10.0;
}

Assistant:

double getPSNR(TRIPLEBYTES **mrx1, TRIPLEBYTES **mrx2, int y, int x, int h, int w, int component) {
    double count = 0;
    for (int i = y; i < h; i++) {
        for (int j = x; j < w; j++) {
            count += pow(getComponent(mrx1, i, j, component) -
                         getComponent(mrx2, i, j, component), 2);
        }
    }
    return 10 * log10(((w - x) * (h - y) * pow(255, 2)) / count);
}